

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::TextureSizeCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,TextureSizeCase *this)

{
  ostream *poVar1;
  undefined1 local_190 [8];
  ostringstream frag;
  TextureSizeCase *this_local;
  
  frag._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 300 es\n");
  std::operator<<(poVar1,"layout(location = 0) out mediump vec4 o_color;\n");
  if ((this->m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)local_190,"in mediump vec4 v_color;\n");
  }
  if ((this->m_isVertexCase & 1U) == 0) {
    poVar1 = std::operator<<((ostream *)local_190,"uniform highp ");
    poVar1 = std::operator<<(poVar1,this->m_samplerTypeStr);
    std::operator<<(poVar1," u_sampler;\n");
    poVar1 = std::operator<<((ostream *)local_190,"uniform highp ivec");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_has3DSize & 1 | 2);
    std::operator<<(poVar1," u_texSize;\n");
    std::operator<<((ostream *)local_190,"uniform highp int u_lod;\n");
  }
  std::operator<<((ostream *)local_190,"void main()\n{\n");
  if ((this->m_isVertexCase & 1U) == 0) {
    std::operator<<((ostream *)local_190,
                    "\to_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n"
                   );
  }
  else {
    std::operator<<((ostream *)local_190,"\to_color = v_color;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSizeCase::genFragmentShader() const
{
	std::ostringstream	frag;

	frag << "#version 300 es\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
			frag << "in mediump vec4 v_color;\n";

	if (!m_isVertexCase)
	{
		frag << "uniform highp " << m_samplerTypeStr << " u_sampler;\n";
		frag << "uniform highp ivec" << (m_has3DSize ? 3 : 2) << " u_texSize;\n";
		frag << "uniform highp int u_lod;\n";
	}

	frag << "void main()\n{\n";

	if (!m_isVertexCase)
		frag << "	o_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n";
	else
		frag << "	o_color = v_color;\n";

	frag << "}\n";

	return frag.str();
}